

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_setpoint.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionPosition_setpoint::SetSetpoint
          (ChFunctionPosition_setpoint *this,ChVector<double> *p_setpoint,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (this->S < s) {
    this->last_s = this->S;
    dVar3 = (this->P).m_data[1];
    dVar1 = (this->P).m_data[2];
    dVar2 = (this->P_ds).m_data[0];
    (this->last_P).m_data[0] = (this->P).m_data[0];
    (this->last_P).m_data[1] = dVar3;
    (this->last_P).m_data[2] = dVar1;
    (this->last_P_ds).m_data[0] = dVar2;
    dVar3 = (this->P_ds).m_data[2];
    (this->last_P_ds).m_data[1] = (this->P_ds).m_data[1];
    (this->last_P_ds).m_data[2] = dVar3;
  }
  this->S = s;
  if (&this->P != p_setpoint) {
    (this->P).m_data[0] = p_setpoint->m_data[0];
    (this->P).m_data[1] = p_setpoint->m_data[1];
    (this->P).m_data[2] = p_setpoint->m_data[2];
  }
  (this->P_ds).m_data[2] = 0.0;
  (this->P_dsds).m_data[0] = 0.0;
  (this->P_dsds).m_data[1] = 0.0;
  (this->P_dsds).m_data[2] = 0.0;
  (this->P_ds).m_data[0] = 0.0;
  (this->P_ds).m_data[1] = 0.0;
  (this->P_ds).m_data[2] = 0.0;
  (this->P_dsds).m_data[0] = 0.0;
  if (this->mode == SOH) {
    dVar3 = s - this->last_s;
    if (0.0 < dVar3) {
      dVar3 = 1.0 / dVar3;
      auVar5 = vsubpd_avx(*(undefined1 (*) [16])(this->P).m_data,
                          *(undefined1 (*) [16])(this->last_P).m_data);
      auVar4._0_8_ = dVar3 * auVar5._0_8_;
      auVar4._8_8_ = dVar3 * auVar5._8_8_;
      *(undefined1 (*) [16])(this->P_ds).m_data = auVar4;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (this->P).m_data[2];
      auVar5 = vunpcklpd_avx(auVar5,auVar4);
      auVar5 = vsubpd_avx(auVar5,*(undefined1 (*) [16])((this->last_P).m_data + 2));
      auVar6._0_8_ = dVar3 * auVar5._0_8_;
      auVar6._8_8_ = dVar3 * auVar5._8_8_;
      *(undefined1 (*) [16])((this->P_ds).m_data + 2) = auVar6;
      auVar5 = vshufpd_avx(auVar4,auVar6,1);
      auVar5 = vsubpd_avx(auVar5,*(undefined1 (*) [16])((this->last_P_ds).m_data + 1));
      (this->P_dsds).m_data[1] = dVar3 * auVar5._0_8_;
      (this->P_dsds).m_data[2] = dVar3 * auVar5._8_8_;
    }
  }
  else if ((this->mode == FOH) && (dVar3 = s - this->last_s, 0.0 < dVar3)) {
    auVar5 = vsubpd_avx(*(undefined1 (*) [16])(this->P).m_data,
                        *(undefined1 (*) [16])(this->last_P).m_data);
    dVar3 = 1.0 / dVar3;
    dVar1 = (this->P).m_data[2];
    dVar2 = (this->last_P).m_data[2];
    (this->P_ds).m_data[0] = dVar3 * auVar5._0_8_;
    (this->P_ds).m_data[1] = dVar3 * auVar5._8_8_;
    (this->P_ds).m_data[2] = dVar3 * (dVar1 - dVar2);
    (this->P_dsds).m_data[2] = 0.0;
    (this->P_dsds).m_data[0] = 0.0;
    (this->P_dsds).m_data[1] = 0.0;
    return;
  }
  return;
}

Assistant:

void ChFunctionPosition_setpoint::SetSetpoint(ChVector<> p_setpoint, double s) {
	
	if (s > S) {  
		// if successive setpoint time, scroll buffer of past samples
		last_s = S;
		last_P = P;
		last_P_ds = P_ds;
	}
	else {
		// if same s, just update last sample
	}

	S = s;
	P = p_setpoint;
	P_ds = 0;
	P_dsds = 0;

	if (mode == ZOH) {
		
	}
	if (mode == FOH) {
		double ds = s - last_s;
		if (ds > 0) {
			P_ds = (P - last_P) / ds;
			P_dsds = 0;
		}
	}
	if (mode == SOH) {
		double ds = s - last_s;
		if (ds > 0) {
			P_ds = (P - last_P) / ds;
			P_dsds = (P_ds - last_P_ds) / ds;
		}
	}
}